

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglApiCase.cpp
# Opt level: O0

void __thiscall
deqp::egl::ApiCase::expectEitherError(ApiCase *this,EGLenum expectedA,EGLenum expectedB)

{
  qpTestResult qVar1;
  Library *pLVar2;
  TestLog *this_00;
  MessageBuilder *pMVar3;
  Enum<int,_2UL> EVar4;
  Enum<int,_2UL> local_200;
  GetNameFunc local_1f0;
  int local_1e8;
  Enum<int,_2UL> local_1e0;
  GetNameFunc local_1d0;
  int local_1c8;
  Enum<int,_2UL> local_1c0 [2];
  MessageBuilder local_1a0;
  EGLenum local_1c;
  EGLenum local_18;
  EGLenum err;
  EGLenum expectedB_local;
  EGLenum expectedA_local;
  ApiCase *this_local;
  
  local_18 = expectedB;
  err = expectedA;
  _expectedB_local = this;
  pLVar2 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  local_1c = (*pLVar2->_vptr_Library[0x1f])();
  if ((local_1c != err) && (local_1c != local_18)) {
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [20])"// ERROR expected: ");
    EVar4 = eglu::getErrorStr(err);
    local_1d0 = EVar4.m_getName;
    local_1c8 = EVar4.m_value;
    local_1c0[0].m_getName = local_1d0;
    local_1c0[0].m_value = local_1c8;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1c0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [5])" or ");
    EVar4 = eglu::getErrorStr(local_18);
    local_1f0 = EVar4.m_getName;
    local_1e8 = EVar4.m_value;
    local_1e0.m_getName = local_1f0;
    local_1e0.m_value = local_1e8;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1e0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [8])", Got: ");
    EVar4 = eglu::getErrorStr(local_1c);
    local_200.m_getName = EVar4.m_getName;
    local_200.m_value = EVar4.m_value;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_200);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
    qVar1 = tcu::TestContext::getTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    if (qVar1 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Got invalid error");
    }
  }
  return;
}

Assistant:

void ApiCase::expectEitherError (EGLenum expectedA, EGLenum expectedB)
{
	EGLenum err = m_eglTestCtx.getLibrary().getError();
	if (err != expectedA && err != expectedB)
	{
		m_testCtx.getLog() << TestLog::Message << "// ERROR expected: " << eglu::getErrorStr(expectedA) << " or " << eglu::getErrorStr(expectedB) << ", Got: " << eglu::getErrorStr(err) << TestLog::EndMessage;
		if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid error");
	}
}